

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_err_t linear_hash_destroy(linear_hash_table_t *linear_hash)

{
  ion_err_t iVar1;
  int iVar2;
  char filename [12];
  
  iVar1 = linear_hash_close(linear_hash);
  if (iVar1 == '\0') {
    dictionary_get_filename((linear_hash->super).id,"lhs",filename);
    iVar2 = remove(filename);
    iVar1 = '\v';
    if (iVar2 == 0) {
      dictionary_get_filename((linear_hash->super).id,"lhd",filename);
      iVar2 = remove(filename);
      iVar1 = '\v';
      if (iVar2 == 0) {
        iVar1 = '\0';
      }
    }
  }
  return iVar1;
}

Assistant:

ion_err_t
linear_hash_destroy(
	linear_hash_table_t *linear_hash
) {
	ion_err_t err = linear_hash_close(linear_hash);

	if (err_ok != err) {
		return err;
	}

	char filename[ION_MAX_FILENAME_LENGTH];

	dictionary_get_filename(linear_hash->super.id, "lhs", filename);

	if (0 != fremove(filename)) {
		return err_file_delete_error;
	}

	dictionary_get_filename(linear_hash->super.id, "lhd", filename);

	if (0 != fremove(filename)) {
		return err_file_delete_error;
	}

	return err_ok;
}